

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
::find_or_prepare_insert<std::shared_ptr<vmips::VirtReg>>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
           *this,shared_ptr<vmips::VirtReg> *key,size_t hashval)

{
  long lVar1;
  h2_t hash;
  bool bVar2;
  size_t sVar3;
  shared_ptr<vmips::VirtReg> *ts;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  pair<unsigned_long,_bool> pVar5;
  bool local_99;
  size_t local_98;
  uint local_90;
  bool local_89;
  size_t local_88;
  EqualElement<std::shared_ptr<vmips::VirtReg>_> local_80;
  int local_70;
  BitMask<unsigned_int,_16,_0> local_6c;
  int i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  size_t hashval_local;
  shared_ptr<vmips::VirtReg> *key_local;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  *this_local;
  bool local_10;
  
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  ::probe((probe_seq<16UL> *)(g.ctrl + 1),
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           *)this,hashval);
  while( true ) {
    lVar1 = *(long *)this;
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1));
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range4,(ctrl_t *)(lVar1 + sVar3));
    hash = H2(hashval);
    __end4 = GroupSse2Impl::Match((GroupSse2Impl *)&__range4,hash);
    i = (int)BitMask<unsigned_int,_16,_0>::begin(&__end4);
    local_6c = BitMask<unsigned_int,_16,_0>::end(&__end4);
    while( true ) {
      bVar2 = priv::operator!=((BitMask<unsigned_int,_16,_0> *)&i,&local_6c);
      if (!bVar2) break;
      local_70 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)&i);
      local_80.rhs = key;
      local_80.eq = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                    ::eq_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                              *)this);
      lVar1 = *(long *)(this + 8);
      sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1),(long)local_70);
      ts = hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,void>
           ::element<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>>
                     ((slot_type *)(lVar1 + sVar3 * 0x10));
      bVar2 = hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,void>
              ::
              apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>::EqualElement<std::shared_ptr<vmips::VirtReg>>,std::shared_ptr<vmips::VirtReg>&,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>>
                        (&local_80,ts);
      if (bVar2) {
        local_88 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1),(long)local_70);
        local_89 = false;
        std::pair<unsigned_long,_bool>::pair<unsigned_long,_bool,_true>
                  ((pair<unsigned_long,_bool> *)&this_local,&local_88,&local_89);
        uVar4 = extraout_RDX;
        goto LAB_001808e1;
      }
      BitMask<unsigned_int,_16,_0>::operator++((BitMask<unsigned_int,_16,_0> *)&i);
    }
    local_90 = (uint)GroupSse2Impl::MatchEmpty((GroupSse2Impl *)&__range4);
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_90);
    if (bVar2) break;
    probe_seq<16UL>::next((probe_seq<16UL> *)(g.ctrl + 1));
  }
  local_98 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
             ::prepare_insert((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                               *)this,hashval);
  local_99 = true;
  std::pair<unsigned_long,_bool>::pair<unsigned_long,_bool,_true>
            ((pair<unsigned_long,_bool> *)&this_local,&local_98,&local_99);
  uVar4 = extraout_RDX_00;
LAB_001808e1:
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = local_10;
  pVar5.first = (unsigned_long)this_local;
  return pVar5;
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval) {
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return {seq.offset((size_t)i), false};
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return {prepare_insert(hashval), true};
    }